

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * cfd::js::api::json::JsonMappingApi::ElementsCreateRawTransaction
                   (string *__return_storage_ptr__,string *request_message)

{
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::ElementsCreateRawTransactionRequestStruct_&)>
  *in_RCX;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_28._8_8_ = 0;
  local_28._0_8_ = ElementsTransactionStructApi::CreateRawTransaction;
  local_18._8_8_ =
       std::
       _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::ElementsCreateRawTransactionRequestStruct_&),_cfd::js::api::RawTransactionResponseStruct_(*)(const_cfd::js::api::ElementsCreateRawTransactionRequestStruct_&)>
       ::_M_invoke;
  local_18._0_8_ =
       std::
       _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::ElementsCreateRawTransactionRequestStruct_&),_cfd::js::api::RawTransactionResponseStruct_(*)(const_cfd::js::api::ElementsCreateRawTransactionRequestStruct_&)>
       ::_M_manager;
  ExecuteJsonApi<cfd::js::api::json::ElementsCreateRawTransactionRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::ElementsCreateRawTransactionRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,in_RCX);
  if ((code *)local_18._0_8_ != (code *)0x0) {
    (*(code *)local_18._0_8_)(local_28,local_28,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::ElementsCreateRawTransaction(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::ElementsCreateRawTransactionRequest,
      api::json::RawTransactionResponse,
      api::ElementsCreateRawTransactionRequestStruct,
      api::RawTransactionResponseStruct>(
      request_message, ElementsTransactionStructApi::CreateRawTransaction);
}